

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O0

int Nwk_ManVerifyCut_rec(Nwk_Obj_t *pObj)

{
  int iVar1;
  bool bVar2;
  int local_24;
  Nwk_Obj_t *pNStack_20;
  int i;
  Nwk_Obj_t *pNext;
  Nwk_Obj_t *pObj_local;
  
  if ((*(uint *)&pObj->field_0x20 >> 4 & 1) == 0) {
    iVar1 = Nwk_ObjIsLo(pObj);
    if (iVar1 == 0) {
      iVar1 = Nwk_ObjIsTravIdCurrent(pObj);
      if (iVar1 == 0) {
        Nwk_ObjSetTravIdCurrent(pObj);
        local_24 = 0;
        while( true ) {
          bVar2 = false;
          if (local_24 < pObj->nFanins) {
            pNStack_20 = pObj->pFanio[local_24];
            bVar2 = pNStack_20 != (Nwk_Obj_t *)0x0;
          }
          if (!bVar2) {
            return 1;
          }
          iVar1 = Nwk_ManVerifyCut_rec(pNStack_20);
          if (iVar1 == 0) break;
          local_24 = local_24 + 1;
        }
        pObj_local._4_4_ = 0;
      }
      else {
        pObj_local._4_4_ = 1;
      }
    }
    else {
      pObj_local._4_4_ = 0;
    }
  }
  else {
    pObj_local._4_4_ = 1;
  }
  return pObj_local._4_4_;
}

Assistant:

int Nwk_ManVerifyCut_rec( Nwk_Obj_t * pObj )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( pObj->MarkA )
        return 1;
    if ( Nwk_ObjIsLo(pObj) )
        return 0;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return 1;
    Nwk_ObjSetTravIdCurrent( pObj );
    Nwk_ObjForEachFanin( pObj, pNext, i )
        if ( !Nwk_ManVerifyCut_rec( pNext ) )
            return 0;
    return 1;
}